

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

Gia_Man_t * Gia_ManFaultCofactor(Gia_Man_t *p,Vec_Int_t *vValues)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *p_01;
  bool bVar6;
  int local_34;
  Gia_Obj_t *pGStack_30;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Int_t *vValues_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  Gia_ManHashAlloc(p_00);
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  local_34 = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar6 = false;
    if (local_34 < iVar1) {
      pGStack_30 = Gia_ManCi(p,local_34);
      bVar6 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    uVar2 = Gia_ManAppendCi(p_00);
    pGStack_30->Value = uVar2;
    iVar1 = Vec_IntSize(vValues);
    if (local_34 < iVar1) {
      uVar2 = Vec_IntEntry(vValues,local_34);
      pGStack_30->Value = uVar2;
    }
    local_34 = local_34 + 1;
  }
  local_34 = 0;
  while( true ) {
    bVar6 = false;
    if (local_34 < p->nObjs) {
      pGStack_30 = Gia_ManObj(p,local_34);
      bVar6 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjIsAnd(pGStack_30);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(pGStack_30);
      iVar3 = Gia_ObjFanin1Copy(pGStack_30);
      uVar2 = Gia_ManHashAnd(p_00,iVar1,iVar3);
      pGStack_30->Value = uVar2;
    }
    local_34 = local_34 + 1;
  }
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar6 = false;
    if (local_34 < iVar1) {
      pGStack_30 = Gia_ManCo(p,local_34);
      bVar6 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjFanin0Copy(pGStack_30);
    uVar2 = Gia_ManAppendCo(p_00,iVar1);
    pGStack_30->Value = uVar2;
    local_34 = local_34 + 1;
  }
  p_01 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  iVar1 = Gia_ManPiNum(p_01);
  iVar3 = Gia_ManPiNum(p);
  if (iVar1 != iVar3) {
    __assert_fail("Gia_ManPiNum(pNew) == Gia_ManPiNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                  ,0x316,"Gia_Man_t *Gia_ManFaultCofactor(Gia_Man_t *, Vec_Int_t *)");
  }
  return p_01;
}

Assistant:

Gia_Man_t * Gia_ManFaultCofactor( Gia_Man_t * p, Vec_Int_t * vValues )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
    {
        pObj->Value = Gia_ManAppendCi( pNew );
        if ( i < Vec_IntSize(vValues) )
            pObj->Value = Vec_IntEntry( vValues, i );
    }
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManPiNum(p) );
    return pNew;

}